

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int bytes_be_to_int(uchar *bytes)

{
  long lVar1;
  uchar *puVar2;
  long in_FS_OFFSET;
  int Result;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = bytes + 3;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(uchar *)((long)&local_c + lVar1) = *puVar2;
    puVar2 = puVar2 + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

int bytes_be_to_int(const unsigned char *bytes)
{
	int Result;
	unsigned char *pResult = (unsigned char *)&Result;
	for(unsigned i = 0; i < sizeof(int); i++)
	{
#if defined(CONF_ARCH_ENDIAN_BIG)
		pResult[i] = bytes[i];
#else
		pResult[i] = bytes[sizeof(int) - i - 1];
#endif
	}
	return Result;
}